

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraySlice.c
# Opt level: O2

sysbvm_tuple_t sysbvm_arraySlice_at(sysbvm_tuple_t arraySlice,size_t index)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  long lVar3;
  
  if ((arraySlice & 0xf) == 0 && arraySlice != 0) {
    uVar1 = *(ulong *)(arraySlice + 0x18);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar3 = (long)uVar1 >> 4;
    }
    else {
      lVar3 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(arraySlice + 0x20);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      uVar1 = (long)uVar1 >> 4;
    }
    else {
      uVar1 = *(ulong *)(uVar1 + 0x10);
    }
    if (uVar1 <= index) {
      sysbvm_error_indexOutOfBounds();
    }
    sVar2 = sysbvm_arrayOrByteArray_at(*(sysbvm_tuple_t *)(arraySlice + 0x10),lVar3 + index);
    return sVar2;
  }
  return 0;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_arraySlice_at(sysbvm_tuple_t arraySlice, size_t index)
{
    if(!sysbvm_tuple_isNonNullPointer(arraySlice)) return SYSBVM_NULL_TUPLE;

    sysbvm_arraySlice_t *arraySliceObject = (sysbvm_arraySlice_t*)arraySlice;
    size_t offset = sysbvm_tuple_size_decode(arraySliceObject->offset);
    size_t size = sysbvm_tuple_size_decode(arraySliceObject->size);
    if(index >= size)
        sysbvm_error_indexOutOfBounds();

    return sysbvm_arrayOrByteArray_at(arraySliceObject->elements, offset + index);
}